

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

Node __thiscall trieste::Parse::parse_file(Parse *this,path *filename)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Node NVar3;
  shared_ptr<trieste::NodeDef> local_a8;
  Source local_98;
  path local_80;
  string local_58;
  undefined1 local_31;
  undefined1 local_30 [8];
  Source source;
  path *filename_local;
  Parse *this_local;
  Node *ast;
  
  source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX;
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)filename[1]._M_pathname.field_2._M_local_buf);
  if ((!bVar1) ||
     (bVar1 = CLI::std::
              function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::
              operator()((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>
                          *)&filename[1]._M_pathname.field_2,(Parse *)filename,
                         (path *)source.
                                 super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi), bVar1)) {
    SourceDef::load((SourceDef *)local_30,
                    (path *)source.
                            super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    local_31 = 0;
    CLI::std::filesystem::__cxx11::path::stem
              (&local_80,
               (path *)source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    CLI::std::filesystem::__cxx11::path::string(&local_58,&local_80);
    Token::Token((Token *)&local_98,(TokenDef *)File);
    parse_source(this,&filename->_M_pathname,(Token *)&local_58,&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    CLI::std::filesystem::__cxx11::path::~path(&local_80);
    bVar1 = std::function::operator_cast_to_bool((function *)(filename + 3));
    if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this), bVar1))
    {
      CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_a8,(shared_ptr<trieste::NodeDef> *)this);
      CLI::std::
      function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
      ::operator()((function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
                    *)(filename + 3),(Parse *)filename,
                   (path *)source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,&local_a8);
      CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_a8);
    }
    local_31 = 1;
    CLI::std::shared_ptr<trieste::SourceDef>::~shared_ptr
              ((shared_ptr<trieste::SourceDef> *)local_30);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this);
    _Var2._M_pi = extraout_RDX;
  }
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_file(const std::filesystem::path& filename) const
    {
      if (prefile_ && !prefile_(*this, filename))
        return {};

      auto source = SourceDef::load(filename);
      auto ast = parse_source(filename.stem().string(), File, source);

      if (postfile_ && ast)
        postfile_(*this, filename, ast);

      return ast;
    }